

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O1

void __thiscall deqp::egl::anon_unknown_1::InfiniteLoop::~InfiniteLoop(InfiniteLoop *this)

{
  (this->super_ContextReset)._vptr_ContextReset = (_func_int **)&PTR__InfiniteLoop_003edb60;
  (*((this->super_ContextReset).m_gl)->getGraphicsResetStatus)();
  (*(this->super_ContextReset)._vptr_ContextReset[4])(this);
  return;
}

Assistant:

InfiniteLoop::~InfiniteLoop (void)
{
	try
	{
		// Reset GL_CONTEXT_LOST error before destroying resources
		m_gl.getGraphicsResetStatus();
		teardown();
	}
	catch (...)
	{
		// Ignore GL errors from teardown()
	}
}